

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeAdd
          (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *this,idx_t row)

{
  DataChunk *result;
  ColumnDataScanState *state;
  size_t sVar1;
  int64_t iVar2;
  reference pvVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  hugeint_t *phVar6;
  ulong uVar7;
  key_type *__k;
  
  state = this->scan;
  if ((state->next_row_index <= row) || (uVar4 = state->current_row_index, row < uVar4)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,row,state,result);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (hugeint_t *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    this->validity = &pvVar3->validity;
    uVar4 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)row - (int)uVar4);
  pmVar5 = ::std::__detail::
           _Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar5->count;
  uVar4 = sVar1 + 1;
  pmVar5->count = uVar4;
  if (sVar1 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar5->first_row = row;
  }
  else {
    uVar7 = pmVar5->first_row;
    if (row < pmVar5->first_row) {
      uVar7 = row;
    }
    pmVar5->first_row = uVar7;
  }
  if (this->count < uVar4) {
    this->valid = true;
    this->count = uVar4;
    phVar6 = this->mode;
    if (phVar6 == (hugeint_t *)0x0) {
      phVar6 = (hugeint_t *)operator_new(0x10);
      iVar2 = __k->upper;
      phVar6->lower = __k->lower;
      phVar6->upper = iVar2;
      this->mode = phVar6;
    }
    else {
      iVar2 = __k->upper;
      phVar6->lower = __k->lower;
      phVar6->upper = iVar2;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}